

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O2

int __thiscall ncnn::YoloDetectionOutput::destroy_pipeline(YoloDetectionOutput *this,Option *opt)

{
  if (this->softmax != (Layer *)0x0) {
    (*this->softmax->_vptr_Layer[5])();
    if (this->softmax != (Layer *)0x0) {
      (*this->softmax->_vptr_Layer[1])();
    }
    this->softmax = (Layer *)0x0;
  }
  return 0;
}

Assistant:

int YoloDetectionOutput::destroy_pipeline(const Option& opt)
{
    if (softmax)
    {
        softmax->destroy_pipeline(opt);
        delete softmax;
        softmax = 0;
    }

    return 0;
}